

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<Symbol> * __thiscall QList<Symbol>::operator+=(QList<Symbol> *this,QList<Symbol> *l)

{
  QList<Symbol> *in_RDI;
  QList<Symbol> *unaff_retaddr;
  
  append(unaff_retaddr,in_RDI);
  return in_RDI;
}

Assistant:

QList<T> &operator+=(QList<T> &&l) { append(std::move(l)); return *this; }